

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O0

Matrix * __thiscall maths::Matrix::operator=(Matrix *this,Matrix *m)

{
  Matrix *in_RSI;
  Matrix *in_RDI;
  int j;
  int i_1;
  int i;
  Matrix *this_00;
  int local_24;
  int local_20;
  int local_1c;
  
  if (in_RDI != in_RSI) {
    if ((in_RDI->rows_ != in_RSI->rows_) || (in_RDI->cols_ != in_RSI->cols_)) {
      for (local_1c = 0; local_1c < in_RDI->rows_; local_1c = local_1c + 1) {
        if (in_RDI->p[local_1c] != (double *)0x0) {
          operator_delete__(in_RDI->p[local_1c]);
        }
      }
      this_00 = (Matrix *)in_RDI->p;
      if (this_00 != (Matrix *)0x0) {
        operator_delete__(this_00);
      }
      in_RDI->rows_ = in_RSI->rows_;
      in_RDI->cols_ = in_RSI->cols_;
      allocSpace(this_00);
    }
    for (local_20 = 0; local_20 < in_RDI->rows_; local_20 = local_20 + 1) {
      for (local_24 = 0; local_24 < in_RDI->cols_; local_24 = local_24 + 1) {
        in_RDI->p[local_20][local_24] = in_RSI->p[local_20][local_24];
      }
    }
  }
  return in_RDI;
}

Assistant:

Matrix& Matrix::operator=(const Matrix& m)
{

    if (this == &m) {
        return *this;
    }

    if (rows_ != m.rows_ || cols_ != m.cols_) {
        for (int i = 0; i < rows_; ++i) {
            delete[] p[i];
        }
        delete[] p;

        rows_ = m.rows_;
        cols_ = m.cols_;
        allocSpace();
    }

    for (int i = 0; i < rows_; ++i) {
        for (int j = 0; j < cols_; ++j) {
            p[i][j] = m.p[i][j];
        }
    }
    return *this;
}